

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeDRMatrix
          (DeadReckoningCalculator *this,TMATRIX *res,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  TMATRIX I;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> local_60;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> local_3c;
  
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix(&local_60);
  dVar2 = (double)((float)totalTimeSinceReset * (float)this->m_f64Magnitude);
  if (dVar2 <= 1e-05) {
    res->Data[2][2] = local_60.Data[2][2];
    *(undefined8 *)(res->Data[1] + 1) = local_60.Data[1]._4_8_;
    *(undefined8 *)res->Data[2] = local_60.Data[2]._0_8_;
    *(undefined8 *)res->Data[0] = local_60.Data[0]._0_8_;
    *(undefined8 *)(res->Data[0] + 2) = local_60.Data._8_8_;
  }
  else {
    dVar3 = cos(dVar2);
    fVar1 = (float)this->m_f64Magnitude;
    uVar4 = *(undefined8 *)((this->m_wwMatrix).Data[0] + 2);
    *(undefined8 *)res->Data[0] = *(undefined8 *)(this->m_wwMatrix).Data[0];
    *(undefined8 *)(res->Data[0] + 2) = uVar4;
    uVar4 = *(undefined8 *)(this->m_wwMatrix).Data[2];
    *(undefined8 *)(res->Data[1] + 1) = *(undefined8 *)((this->m_wwMatrix).Data[1] + 1);
    *(undefined8 *)res->Data[2] = uVar4;
    res->Data[2][2] = (this->m_wwMatrix).Data[2][2];
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              ((Matrix<float,(unsigned_char)3,(unsigned_char)3> *)res,
               (double)((1.0 - (float)dVar3) / (fVar1 * fVar1)));
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              ((Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&local_60,(float)dVar3);
    dVar2 = sin(dVar2);
    fVar1 = (float)this->m_f64Magnitude;
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=(res,&local_60);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*
              (&local_3c,(Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&this->m_SkewOmegaMatrix
               ,dVar2 / (double)fVar1);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator-=(res,&local_3c);
  }
  return;
}

Assistant:

void DeadReckoningCalculator::computeDRMatrix( TMATRIX& res, const KFLOAT32 totalTimeSinceReset )
{
    TMATRIX I;
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;
    if( f64DeltaMag > MAGIC_EPSILON )
    {
        const KFLOAT32 f64CosMagDelta = cos( f64DeltaMag );
        const KFLOAT64 fwwScalar = ( 1 - f64CosMagDelta ) / ( m_f64Magnitude * m_f64Magnitude );
        res = m_wwMatrix;
        res *= fwwScalar;
        I *= f64CosMagDelta;
        const KFLOAT64 f64SkewScalar = sin( f64DeltaMag ) / m_f64Magnitude;
        res += I;
        res -= ( m_SkewOmegaMatrix * f64SkewScalar );
    }
    else
    {
        res = I; // Identity matrix
    }
}